

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void FillDistancesPrices(CLzmaEnc *p)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  UInt32 delta;
  int iVar7;
  ulong uVar8;
  UInt32 *pUVar9;
  uint uVar10;
  CLzmaProb *pCVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  UInt32 (*paUVar16) [64];
  uint uVar17;
  CLzmaEnc *pCVar18;
  int aiStack_238 [4];
  undefined8 auStack_228 [63];
  
  p->matchPriceCount = 0;
  for (uVar8 = 2; uVar8 != 0x40; uVar8 = uVar8 + 1) {
    iVar3 = (p->g_FastPos[uVar8] >> 1) - 1;
    bVar2 = (byte)iVar3;
    uVar10 = (p->g_FastPos[uVar8] & 1 | 2) << (bVar2 & 0x1f);
    uVar4 = 1;
    iVar12 = 0;
    iVar7 = 0;
    if (iVar3 == 0) {
      uVar5 = 1;
    }
    else {
      uVar5 = uVar8 & 0xffffffff;
      do {
        uVar17 = (uint)uVar5 & 1;
        uVar14 = (ulong)uVar4;
        uVar4 = uVar17 + uVar4 * 2;
        uVar5 = uVar5 >> 1;
        iVar12 = iVar12 + p->ProbPrices
                          [(-uVar17 & 0x7f0 ^ (uint)p->posEncoders[(ulong)uVar10 * 2 + uVar14]) >> 4
                          ];
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      uVar5 = (ulong)uVar4;
      iVar7 = iVar12;
    }
    uVar17 = uVar10 + (int)uVar8;
    uVar4 = p->posEncoders[(ulong)uVar10 * 2 + uVar5] >> 2 & 0xfffffffc;
    aiStack_238[uVar17] = *(int *)((long)p->ProbPrices + (ulong)uVar4) + iVar7;
    aiStack_238[uVar17 + (1 << (bVar2 & 0x1f))] =
         iVar7 + *(int *)((long)p->ProbPrices + (ulong)(uVar4 ^ 0x1fc));
  }
  uVar8 = (ulong)(p->distTableSize + 1 >> 1);
  pUVar9 = p->posSlotPrices[0] + 1;
  pCVar11 = p->posSlotEncoder[0] + 0x20;
  lVar13 = 0;
  pCVar18 = p;
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    paUVar16 = p->posSlotPrices + lVar15;
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = (uint)uVar5;
      uVar10 = uVar4 + 0x20;
      iVar7 = p->ProbPrices
              [((int)(uVar4 << 0x1e) >> 0x1f & 0x7f0U ^ (uint)p->posSlotEncoder[lVar15][uVar10 >> 2]
               ) >> 4] +
              p->ProbPrices
              [(-(uVar4 & 1) & 0x7f0 ^
               (uint)*(ushort *)((long)p->posSlotEncoder[lVar15] + (ulong)(uVar10 & 0xfffffffe))) >>
               4] + p->ProbPrices
                    [((int)(uVar4 << 0x1d) >> 0x1f & 0x7f0U ^
                     (uint)*(ushort *)
                            ((long)p->posSlotEncoder[lVar15] + (ulong)(uVar10 >> 2 & 0xfffffffe)))
                     >> 4] +
              p->ProbPrices
              [((int)(uVar4 << 0x1c) >> 0x1f & 0x7f0U ^ (uint)p->posSlotEncoder[lVar15][uVar10 >> 4]
               ) >> 4] +
              p->ProbPrices
              [((int)(uVar4 << 0x1b) >> 0x1f & 0x7f0U ^
               (uint)*(ushort *)
                      ((long)p->posSlotEncoder[lVar15] + (ulong)(uVar10 >> 4 & 0xfffffffe))) >> 4];
      uVar4 = pCVar11[uVar5] >> 2 & 0xfffffffc;
      pUVar9[uVar5 * 2 + -1] = *(int *)((long)p->ProbPrices + (ulong)uVar4) + iVar7;
      pUVar9[uVar5 * 2] = iVar7 + *(int *)((long)p->ProbPrices + (ulong)(uVar4 ^ 0x1fc));
    }
    iVar7 = 0x20;
    for (lVar6 = 0x212; lVar6 - 0x20bU < uVar8; lVar6 = lVar6 + 1) {
      *(ulong *)(pCVar18->reps + lVar6 * 2 + -0x14) =
           CONCAT44(iVar7 + (int)((ulong)*(undefined8 *)(pCVar18->reps + lVar6 * 2 + -0x14) >> 0x20)
                    ,iVar7 + (int)*(undefined8 *)(pCVar18->reps + lVar6 * 2 + -0x14));
      iVar7 = iVar7 + 0x10;
    }
    uVar1 = *(undefined8 *)(*paUVar16 + 2);
    *(undefined8 *)p->distancesPrices[lVar15] = *(undefined8 *)*paUVar16;
    *(undefined8 *)(p->distancesPrices[lVar15] + 2) = uVar1;
    for (lVar6 = 0; lVar6 + 4U < 0x80; lVar6 = lVar6 + 2) {
      uVar1 = *(undefined8 *)((long)auStack_228 + lVar6 * 4);
      *(ulong *)((long)p->distancesPrices[0] + lVar6 * 4 + lVar13 + 0x10) =
           CONCAT44((*paUVar16)[p->g_FastPos[lVar6 + 4]] + (int)((ulong)uVar1 >> 0x20),
                    (*paUVar16)[p->g_FastPos[lVar6 + 4]] + (int)uVar1);
    }
    pUVar9 = pUVar9 + 0x40;
    pCVar11 = pCVar11 + 0x40;
    pCVar18 = (CLzmaEnc *)&pCVar18->matchFinderBase;
    lVar13 = lVar13 + 0x200;
  }
  return;
}

Assistant:

Z7_NO_INLINE static void FillDistancesPrices(CLzmaEnc *p)
{
  // int y; for (y = 0; y < 100; y++) {

  UInt32 tempPrices[kNumFullDistances];
  unsigned i, lps;

  const CProbPrice *ProbPrices = p->ProbPrices;
  p->matchPriceCount = 0;

  for (i = kStartPosModelIndex / 2; i < kNumFullDistances / 2; i++)
  {
    unsigned posSlot = GetPosSlot1(i);
    unsigned footerBits = (posSlot >> 1) - 1;
    unsigned base = ((2 | (posSlot & 1)) << footerBits);
    const CLzmaProb *probs = p->posEncoders + (size_t)base * 2;
    // tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base, footerBits, i - base, p->ProbPrices);
    UInt32 price = 0;
    unsigned m = 1;
    unsigned sym = i;
    unsigned offset = (unsigned)1 << footerBits;
    base += i;
    
    if (footerBits)
    do
    {
      unsigned bit = sym & 1;
      sym >>= 1;
      price += GET_PRICEa(probs[m], bit);
      m = (m << 1) + bit;
    }
    while (--footerBits);

    {
      unsigned prob = probs[m];
      tempPrices[base         ] = price + GET_PRICEa_0(prob);
      tempPrices[base + offset] = price + GET_PRICEa_1(prob);
    }
  }

  for (lps = 0; lps < kNumLenToPosStates; lps++)
  {
    unsigned slot;
    unsigned distTableSize2 = (p->distTableSize + 1) >> 1;
    UInt32 *posSlotPrices = p->posSlotPrices[lps];
    const CLzmaProb *probs = p->posSlotEncoder[lps];
    
    for (slot = 0; slot < distTableSize2; slot++)
    {
      // posSlotPrices[slot] = RcTree_GetPrice(encoder, kNumPosSlotBits, slot, p->ProbPrices);
      UInt32 price;
      unsigned bit;
      unsigned sym = slot + (1 << (kNumPosSlotBits - 1));
      unsigned prob;
      bit = sym & 1; sym >>= 1; price  = GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      prob = probs[(size_t)slot + (1 << (kNumPosSlotBits - 1))];
      posSlotPrices[(size_t)slot * 2    ] = price + GET_PRICEa_0(prob);
      posSlotPrices[(size_t)slot * 2 + 1] = price + GET_PRICEa_1(prob);
    }
    
    {
      UInt32 delta = ((UInt32)((kEndPosModelIndex / 2 - 1) - kNumAlignBits) << kNumBitPriceShiftBits);
      for (slot = kEndPosModelIndex / 2; slot < distTableSize2; slot++)
      {
        posSlotPrices[(size_t)slot * 2    ] += delta;
        posSlotPrices[(size_t)slot * 2 + 1] += delta;
        delta += ((UInt32)1 << kNumBitPriceShiftBits);
      }
    }

    {
      UInt32 *dp = p->distancesPrices[lps];
      
      dp[0] = posSlotPrices[0];
      dp[1] = posSlotPrices[1];
      dp[2] = posSlotPrices[2];
      dp[3] = posSlotPrices[3];

      for (i = 4; i < kNumFullDistances; i += 2)
      {
        UInt32 slotPrice = posSlotPrices[GetPosSlot1(i)];
        dp[i    ] = slotPrice + tempPrices[i];
        dp[i + 1] = slotPrice + tempPrices[i + 1];
      }
    }
  }
  // }
}